

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O1

int secp256k1_ecdsa_verify
              (secp256k1_context *ctx,secp256k1_ecdsa_signature *sig,uchar *msghash32,
              secp256k1_pubkey *pubkey)

{
  int iVar1;
  secp256k1_scalar r;
  secp256k1_scalar s;
  secp256k1_scalar m;
  secp256k1_ge q;
  secp256k1_scalar local_e8;
  secp256k1_scalar local_c8;
  secp256k1_scalar local_a8;
  secp256k1_ge local_88;
  
  if (ctx == (secp256k1_context *)0x0) {
    secp256k1_ecdsa_verify_cold_4();
  }
  else if (msghash32 != (uchar *)0x0) {
    if (sig == (secp256k1_ecdsa_signature *)0x0) {
      secp256k1_ecdsa_verify_cold_2();
      return 0;
    }
    if (pubkey == (secp256k1_pubkey *)0x0) {
      secp256k1_ecdsa_verify_cold_1();
      return 0;
    }
    secp256k1_scalar_set_b32(&local_a8,msghash32,(int *)0x0);
    local_e8.d[0] = *(uint64_t *)sig->data;
    local_e8.d[1] = *(uint64_t *)(sig->data + 8);
    local_e8.d[2] = *(uint64_t *)(sig->data + 0x10);
    local_e8.d[3] = *(uint64_t *)(sig->data + 0x18);
    local_c8.d[0] = *(uint64_t *)(sig->data + 0x20);
    local_c8.d[1] = *(uint64_t *)(sig->data + 0x28);
    local_c8.d[2] = *(uint64_t *)(sig->data + 0x30);
    local_c8.d[3] = *(uint64_t *)(sig->data + 0x38);
    iVar1 = secp256k1_scalar_is_high(&local_c8);
    if (iVar1 != 0) {
      return 0;
    }
    iVar1 = secp256k1_pubkey_load(ctx,&local_88,pubkey);
    if (iVar1 != 0) {
      iVar1 = secp256k1_ecdsa_sig_verify(&local_e8,&local_c8,&local_88,&local_a8);
      return iVar1;
    }
    return 0;
  }
  secp256k1_ecdsa_verify_cold_3();
  return 0;
}

Assistant:

int secp256k1_ecdsa_verify(const secp256k1_context* ctx, const secp256k1_ecdsa_signature *sig, const unsigned char *msghash32, const secp256k1_pubkey *pubkey) {
    secp256k1_ge q;
    secp256k1_scalar r, s;
    secp256k1_scalar m;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(msghash32 != NULL);
    ARG_CHECK(sig != NULL);
    ARG_CHECK(pubkey != NULL);

    secp256k1_scalar_set_b32(&m, msghash32, NULL);
    secp256k1_ecdsa_signature_load(ctx, &r, &s, sig);
    return (!secp256k1_scalar_is_high(&s) &&
            secp256k1_pubkey_load(ctx, &q, pubkey) &&
            secp256k1_ecdsa_sig_verify(&r, &s, &q, &m));
}